

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase51::run(TestCase51 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> *orphan_00;
  MessageSize MVar2;
  bool local_1b1;
  uint64_t uStack_1b0;
  bool _kj_shouldLog_2;
  uint local_1a8;
  int local_1a0;
  bool local_199;
  uint64_t uStack_198;
  bool _kj_shouldLog_1;
  uint local_190;
  Orphanage local_188;
  undefined1 local_178 [8];
  Orphan<capnproto_test::capnp::test::TestEmptyStruct> orphan;
  undefined1 local_150 [7];
  bool _kj_shouldLog;
  Builder anyPointer;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase51 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAnyPointer>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestAnyPointer::Builder::getAnyPointerField
            ((Builder *)local_150,(Builder *)local_128);
  bVar1 = AnyPointer::Builder::isNull((Builder *)local_150);
  if (!bVar1) {
    orphan.builder.location._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while ((bool)orphan.builder.location._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[37]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x37,ERROR,"\"failed: expected \" \"anyPointer.isNull()\"",
                 (char (*) [37])"failed: expected anyPointer.isNull()");
      orphan.builder.location._7_1_ = false;
    }
  }
  local_188 = MessageBuilder::getOrphanage((MessageBuilder *)&root._builder.dataSize);
  Orphanage::newOrphan<capnproto_test::capnp::test::TestEmptyStruct>
            ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_178,&local_188);
  orphan_00 = kj::mv<capnp::Orphan<capnproto_test::capnp::test::TestEmptyStruct>>
                        ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_178);
  AnyPointer::Builder::adopt<capnproto_test::capnp::test::TestEmptyStruct>
            ((Builder *)local_150,orphan_00);
  MVar2 = AnyPointer::Builder::targetSize((Builder *)local_150);
  uStack_198 = MVar2.wordCount;
  local_190 = MVar2.capCount;
  if (uStack_198 != 0) {
    local_199 = kj::_::Debug::shouldLog(ERROR);
    while (local_199 != false) {
      local_1a0 = 0;
      MVar2 = AnyPointer::Builder::targetSize((Builder *)local_150);
      uStack_1b0 = MVar2.wordCount;
      local_1a8 = MVar2.capCount;
      kj::_::Debug::log<char_const(&)[60],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x3a,ERROR,
                 "\"failed: expected \" \"(0) == (anyPointer.targetSize().wordCount)\", 0, anyPointer.targetSize().wordCount"
                 ,(char (*) [60])"failed: expected (0) == (anyPointer.targetSize().wordCount)",
                 &local_1a0,&stack0xfffffffffffffe50);
      local_199 = false;
    }
  }
  bVar1 = AnyPointer::Builder::isNull((Builder *)local_150);
  if (bVar1) {
    local_1b1 = kj::_::Debug::shouldLog(ERROR);
    while (local_1b1 != false) {
      kj::_::Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x3b,ERROR,"\"failed: expected \" \"!(anyPointer.isNull())\"",
                 (char (*) [40])"failed: expected !(anyPointer.isNull())");
      local_1b1 = false;
    }
  }
  Orphan<capnproto_test::capnp::test::TestEmptyStruct>::~Orphan
            ((Orphan<capnproto_test::capnp::test::TestEmptyStruct> *)local_178);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Orphans, EmptyStruct) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<test::TestAnyPointer>();
  auto anyPointer = root.getAnyPointerField();
  EXPECT_TRUE(anyPointer.isNull());
  auto orphan = builder.getOrphanage().newOrphan<test::TestEmptyStruct>();
  anyPointer.adopt(kj::mv(orphan));
  EXPECT_EQ(0, anyPointer.targetSize().wordCount);
  EXPECT_FALSE(anyPointer.isNull());
}